

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<CodePointerAlias,_CodePointerAlias>::ShrinkToFit
          (TArray<CodePointerAlias,_CodePointerAlias> *this)

{
  uint uVar1;
  CodePointerAlias *pCVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (CodePointerAlias *)0x0) {
        return;
      }
      M_Free(this->Array);
      pCVar2 = (CodePointerAlias *)0x0;
    }
    else {
      pCVar2 = (CodePointerAlias *)
               M_Realloc_Dbg(this->Array,(ulong)uVar1 * 0x1c,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x1ad);
    }
    this->Array = pCVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}